

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_ror(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *b_01;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *pBVar3;
  BtorSimBitVector *res;
  BtorSimBitVector *local_30;
  
  b_00 = btorsim_bv_uint64_to_bv((ulong)a->width,a->width);
  local_30 = (BtorSimBitVector *)0x0;
  udiv_urem_bv(b,b_00,(BtorSimBitVector **)0x0,&local_30);
  pBVar2 = local_30;
  pBVar1 = btorsim_bv_neg(local_30);
  b_01 = btorsim_bv_add(b_00,pBVar1);
  free(pBVar1);
  pBVar2 = btorsim_bv_srl(a,pBVar2);
  pBVar1 = btorsim_bv_sll(a,b_01);
  pBVar3 = btorsim_bv_or(pBVar2,pBVar1);
  free(b_00);
  free(b_01);
  free(pBVar2);
  free(pBVar1);
  return pBVar3;
}

Assistant:

BtorSimBitVector *
btorsim_bv_ror (const BtorSimBitVector *a, const BtorSimBitVector *b) {
  BtorSimBitVector *width = btorsim_bv_uint64_to_bv(a->width, a->width);
  BtorSimBitVector *rem = btorsim_bv_urem(b, width);
  BtorSimBitVector *rev = btorsim_bv_sub(width, rem);

  BtorSimBitVector *srl_part = btorsim_bv_srl(a, rem);
  BtorSimBitVector *sll_part = btorsim_bv_sll(a, rev);
  BtorSimBitVector *res = btorsim_bv_or(srl_part, sll_part);

  btorsim_bv_free(width);
  btorsim_bv_free(rev);
  btorsim_bv_free(srl_part);
  btorsim_bv_free(sll_part);
  return res;
}